

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

int minstadisintegrate(monst *mon)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  char *oldstr;
  char *local_38;
  int local_2c;
  uint local_20;
  int local_1c;
  int result;
  monst *mon_local;
  
  local_20 = (uint)mon->data->cwt;
  if (((mon->mintrinsics & 8) != 0) || (iVar2 = rn2(0x14), iVar2 == 0)) {
    return 0;
  }
  if (local_20 < 0x65) {
    local_20 = 1;
  }
  else {
    local_20 = local_20 / 100;
  }
  local_1c = rnd(local_20);
  if (6 < local_1c) {
    local_1c = 6;
  }
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_0030f68e;
    if (((((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        ((u.uprops[0x40].intrinsic != 0 ||
         ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
       ((mon->data->mflags3 & 0x200) != 0)) {
      bVar1 = viz_array[mon->my][mon->mx] & 1;
      goto joined_r0x0030f688;
    }
  }
  else {
    bVar1 = worm_known(level,mon);
joined_r0x0030f688:
    if (bVar1 != 0) {
LAB_0030f68e:
      if (((((((*(uint *)&mon->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
            (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
          (((*(uint *)&mon->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mon->field_0x60 >> 9 & 1) == 0)
           ))) && (((byte)u._1052_1_ >> 5 & 1) == 0)) {
        pcVar3 = Monnam(mon);
        pline("%s disintegrates!",pcVar3);
      }
    }
  }
  if (((mon->data != mons + 0x144) && (mon->data != mons + 0x146)) && (mon->data != mons + 0x145)) {
    mondead_helper(mon,5);
    return local_1c;
  }
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         (((u.uprops[0x40].intrinsic == 0 &&
           ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
          ((mon->data->mflags3 & 0x200) == 0)))) goto LAB_0030fa41;
      bVar1 = viz_array[mon->my][mon->mx] & 1;
      goto joined_r0x0030f8d3;
    }
  }
  else {
    bVar1 = worm_known(level,mon);
joined_r0x0030f8d3:
    if (bVar1 == 0) goto LAB_0030fa41;
  }
  if ((((((*(uint *)&mon->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     ((((*(uint *)&mon->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mon->field_0x60 >> 9 & 1) == 0)) &&
      (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
    pcVar3 = Monnam(mon);
    pcVar3 = s_suffix(pcVar3);
    if (((youmonst.data)->mflags1 & 0x1000) == 0) {
      local_2c = 2;
      if (youmonst.data == mons + 0x17b || youmonst.data == mons + 0x1e) {
        local_2c = 1;
      }
    }
    else {
      local_2c = 0;
    }
    if (local_2c == 1) {
      local_38 = body_part(1);
    }
    else {
      oldstr = body_part(1);
      local_38 = makeplural(oldstr);
    }
    pline("%s body reintegrates before your %s!",pcVar3,local_38);
  }
LAB_0030fa41:
  mon->mhp = mon->mhpmax;
  return local_1c;
}

Assistant:

int minstadisintegrate(struct monst *mon)
{
	int result = mon->data->cwt;
	if (resists_disint(mon) || !rn2(20)) return 0;
	weight_dmg(result);
	if (canseemon(level, mon))
	    pline("%s disintegrates!", Monnam(mon));
	if (is_rider(mon->data)) {
	    if (canseemon(level, mon)) {
		pline("%s body reintegrates before your %s!",
		      s_suffix(Monnam(mon)),
		      (eyecount(youmonst.data) == 1) ?
			  body_part(EYE) : makeplural(body_part(EYE)));
	    }
	    mon->mhp = mon->mhpmax;
	} else {
	    mondead_helper(mon, AD_DISN);
	}
	return result;
}